

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExecProgramCommand.cxx
# Opt level: O1

bool __thiscall
cmExecProgramCommand::InitialPass
          (cmExecProgramCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  bool bVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  size_type sVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *dir;
  long lVar11;
  pointer pbVar12;
  bool bVar13;
  int iVar14;
  bool bVar15;
  int retVal;
  string command;
  string output_variable;
  string arguments;
  string coutput;
  string return_variable;
  string output;
  uint local_14c;
  cmCommand *local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_140;
  char *local_138;
  undefined8 local_130;
  char local_128;
  undefined7 uStack_127;
  string local_118;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8;
  undefined7 uStack_e7;
  string local_d8 [3];
  string local_70;
  string local_50;
  
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_148 = &this->super_cmCommand;
  if (pbVar12 == pbVar2) {
    local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d8,"called with incorrect number of arguments","");
    cmCommand::SetError(local_148,local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
      operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
    }
    bVar15 = false;
  }
  else {
    local_f8 = &local_e8;
    bVar15 = false;
    local_f0 = 0;
    local_e8 = 0;
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    local_118._M_string_length = 0;
    local_118.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    bVar7 = false;
    bVar13 = false;
    iVar14 = 0;
    bVar6 = false;
    local_140 = args;
    do {
      iVar8 = std::__cxx11::string::compare((char *)pbVar12);
      if (iVar8 == 0) {
        bVar13 = true;
        bVar6 = false;
LAB_001816a2:
        bVar7 = false;
LAB_00181770:
        iVar14 = iVar14 + 1;
        bVar3 = true;
      }
      else if (bVar13) {
        if (local_118._M_string_length == 0) {
          std::__cxx11::string::_M_assign((string *)&local_118);
          iVar14 = iVar14 + 1;
          bVar3 = true;
          bVar13 = false;
        }
        else {
          local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_d8,"called with incorrect number of arguments","");
          cmCommand::SetError(local_148,local_d8);
LAB_0018171b:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
            operator_delete(local_d8[0]._M_dataplus._M_p,
                            local_d8[0].field_2._M_allocated_capacity + 1);
          }
          bVar3 = false;
        }
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)pbVar12);
        if (iVar8 == 0) {
          bVar7 = true;
          bVar6 = false;
          bVar13 = false;
          goto LAB_00181770;
        }
        if (bVar7) {
          if (local_70._M_string_length != 0) {
            local_d8[0]._M_dataplus._M_p = (pointer)&local_d8[0].field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_d8,"called with incorrect number of arguments","");
            cmCommand::SetError(local_148,local_d8);
            goto LAB_0018171b;
          }
          std::__cxx11::string::_M_assign((string *)&local_70);
          iVar14 = iVar14 + 1;
          bVar3 = true;
          bVar7 = false;
        }
        else {
          iVar8 = std::__cxx11::string::compare((char *)pbVar12);
          if (iVar8 == 0) {
            bVar6 = true;
            bVar13 = false;
            goto LAB_001816a2;
          }
          bVar3 = true;
          if (bVar6) {
            std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(pbVar12->_M_dataplus)._M_p);
            std::__cxx11::string::append((char *)&local_f8);
            iVar14 = iVar14 + 1;
          }
        }
      }
      pvVar4 = local_140;
      if (!bVar3) break;
      pbVar12 = pbVar12 + 1;
      bVar15 = pbVar12 == pbVar2;
    } while (!bVar15);
    if (bVar15) {
      local_138 = &local_128;
      local_130 = 0;
      local_128 = '\0';
      if (local_f0 == 0) {
        std::__cxx11::string::_M_assign((string *)&local_138);
      }
      else {
        cmSystemTools::ConvertToRunCommandPath
                  (local_d8,(local_140->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        std::__cxx11::string::operator=((string *)&local_138,(string *)local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
          operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1
                         );
        }
        std::__cxx11::string::append((char *)&local_138);
        std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_f8);
      }
      sVar5 = local_118._M_string_length;
      local_14c = 0;
      paVar1 = &local_50.field_2;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      pbVar12 = (pvVar4->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      if (((long)(pvVar4->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar12 >> 5) - (long)iVar14 ==
          2) {
        cmsys::SystemTools::MakeDirectory(pbVar12 + 1,(mode_t *)0x0);
        dir = (pvVar4->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
      }
      else {
        dir = (char *)0x0;
      }
      bVar7 = RunCommand(local_138,&local_50,(int *)&local_14c,dir,sVar5 == 0,Auto);
      if (!bVar7) {
        local_14c = 0xffffffff;
      }
      if (local_118._M_string_length != 0) {
        uVar9 = std::__cxx11::string::find_first_not_of((char *)&local_50,0x4877d4,0);
        lVar10 = std::__cxx11::string::find_last_not_of
                           ((char *)&local_50,0x4877d4,0xffffffffffffffff);
        if (uVar9 == 0xffffffffffffffff) {
          uVar9 = 0;
        }
        lVar11 = local_50._M_string_length - 1;
        if (lVar10 != -1) {
          lVar11 = lVar10;
        }
        std::__cxx11::string::string
                  ((string *)local_d8,(string *)&local_50,uVar9,(lVar11 - uVar9) + 1);
        cmMakefile::AddDefinition(local_148->Makefile,&local_118,local_d8[0]._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
          operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1
                         );
        }
      }
      if (local_70._M_string_length != 0) {
        sprintf((char *)local_d8,"%d",(ulong)local_14c);
        cmMakefile::AddDefinition(local_148->Makefile,&local_70,(char *)local_d8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      if (local_138 != &local_128) {
        operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,
                      CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                               local_118.field_2._M_local_buf[0]) + 1);
    }
    if (local_f8 != &local_e8) {
      operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
    }
  }
  return bVar15;
}

Assistant:

bool cmExecProgramCommand::InitialPass(std::vector<std::string> const& args,
                                       cmExecutionStatus&)
{
  if (args.empty()) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string arguments;
  bool doingargs = false;
  int count = 0;
  std::string output_variable;
  bool haveoutput_variable = false;
  std::string return_variable;
  bool havereturn_variable = false;
  for (std::string const& arg : args) {
    if (arg == "OUTPUT_VARIABLE") {
      count++;
      doingargs = false;
      havereturn_variable = false;
      haveoutput_variable = true;
    } else if (haveoutput_variable) {
      if (!output_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      output_variable = arg;
      haveoutput_variable = false;
      count++;
    } else if (arg == "RETURN_VALUE") {
      count++;
      doingargs = false;
      haveoutput_variable = false;
      havereturn_variable = true;
    } else if (havereturn_variable) {
      if (!return_variable.empty()) {
        this->SetError("called with incorrect number of arguments");
        return false;
      }
      return_variable = arg;
      havereturn_variable = false;
      count++;
    } else if (arg == "ARGS") {
      count++;
      havereturn_variable = false;
      haveoutput_variable = false;
      doingargs = true;
    } else if (doingargs) {
      arguments += arg;
      arguments += " ";
      count++;
    }
  }

  std::string command;
  if (!arguments.empty()) {
    command = cmSystemTools::ConvertToRunCommandPath(args[0]);
    command += " ";
    command += arguments;
  } else {
    command = args[0];
  }
  bool verbose = true;
  if (!output_variable.empty()) {
    verbose = false;
  }
  int retVal = 0;
  std::string output;
  bool result = true;
  if (args.size() - count == 2) {
    cmSystemTools::MakeDirectory(args[1]);
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              args[1].c_str(), verbose);
  } else {
    result = cmExecProgramCommand::RunCommand(command.c_str(), output, retVal,
                                              nullptr, verbose);
  }
  if (!result) {
    retVal = -1;
  }

  if (!output_variable.empty()) {
    std::string::size_type first = output.find_first_not_of(" \n\t\r");
    std::string::size_type last = output.find_last_not_of(" \n\t\r");
    if (first == std::string::npos) {
      first = 0;
    }
    if (last == std::string::npos) {
      last = output.size() - 1;
    }

    std::string coutput = std::string(output, first, last - first + 1);
    this->Makefile->AddDefinition(output_variable, coutput.c_str());
  }

  if (!return_variable.empty()) {
    char buffer[100];
    sprintf(buffer, "%d", retVal);
    this->Makefile->AddDefinition(return_variable, buffer);
  }

  return true;
}